

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode trynextip(Curl_easy *data,connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  Curl_addrinfo *local_30;
  Curl_addrinfo *ai;
  curl_socket_t fd_to_close;
  CURLcode result;
  int tempindex_local;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ai._4_4_ = CURLE_COULDNT_CONNECT;
  sock = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = -1;
  if (sockindex == 0) {
    local_30 = conn->tempaddr[tempindex];
    while ((local_30 != (Curl_addrinfo *)0x0 &&
           (ai._4_4_ = singleipconnect(data,conn,local_30,tempindex),
           ai._4_4_ == CURLE_COULDNT_CONNECT))) {
      local_30 = ainext(conn,tempindex,true);
    }
  }
  if (sock != -1) {
    Curl_closesocket(data,conn,sock);
  }
  return ai._4_4_;
}

Assistant:

static CURLcode trynextip(struct Curl_easy *data,
                          struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  CURLcode result = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    struct Curl_addrinfo *ai = conn->tempaddr[tempindex];

    while(ai) {
      result = singleipconnect(data, conn, ai, tempindex);
      if(result == CURLE_COULDNT_CONNECT) {
        ai = ainext(conn, tempindex, TRUE);
        continue;
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(data, conn, fd_to_close);

  return result;
}